

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wajah.h
# Opt level: O0

void __thiscall Wajah::print(Wajah *this,FrameBuffer *fb)

{
  FrameBuffer *fb_local;
  Wajah *this_local;
  
  Polygon::print((FrameBuffer *)this->kepala);
  Polygon::print((FrameBuffer *)this->aliskiri);
  Polygon::print((FrameBuffer *)this->aliskanan);
  if (this->mode == 1) {
    Polygon::print((FrameBuffer *)this->mulut);
    Polygon::print((FrameBuffer *)this->matakanan);
    Polygon::print((FrameBuffer *)this->matakiri);
    Polygon::print((FrameBuffer *)this->bolakanan);
    Polygon::print((FrameBuffer *)this->bolakiri);
  }
  else if (this->mode == 2) {
    Polygon::print((FrameBuffer *)this->bibirlebar);
    Polygon::print((FrameBuffer *)this->senyum);
    Polygon::print((FrameBuffer *)this->matakanan);
    Polygon::print((FrameBuffer *)this->matakiri);
    Polygon::print((FrameBuffer *)this->bolakanan);
    Polygon::print((FrameBuffer *)this->bolakiri);
  }
  else if (this->mode == 3) {
    Polygon::print((FrameBuffer *)this->bibirsempit);
    Polygon::print((FrameBuffer *)this->sedih);
    Polygon::print((FrameBuffer *)this->matakanansipit);
    Polygon::print((FrameBuffer *)this->matakirisipit);
    Polygon::print((FrameBuffer *)this->tangisankiri);
    Polygon::print((FrameBuffer *)this->tangisankanan);
    Polygon::print((FrameBuffer *)this->bolakanan);
    Polygon::print((FrameBuffer *)this->bolakiri);
  }
  else if (this->mode == 4) {
    Polygon::print((FrameBuffer *)this->mulut);
    Polygon::print((FrameBuffer *)this->matakananmerem);
    Polygon::print((FrameBuffer *)this->matakirimerem);
  }
  else if (this->mode == 5) {
    Polygon::print((FrameBuffer *)this->bibirlebar);
    Polygon::print((FrameBuffer *)this->tertawa);
    Polygon::print((FrameBuffer *)this->gigi);
    Polygon::print((FrameBuffer *)this->matakananmerem);
    Polygon::print((FrameBuffer *)this->matakirimerem);
  }
  Polygon::print((FrameBuffer *)this->rambut);
  Polygon::print_frame((FrameBuffer *)this->rambut,(int)fb,0xff,0xff,0xff);
  return;
}

Assistant:

void print(FrameBuffer& fb){
    kepala->print(fb);
    //hidKanan->print(fb);
    //hidKiri->print(fb);
    //hidung->print(fb);
    aliskiri->print(fb);
    aliskanan->print(fb);
    if(mode==1){
      mulut->print(fb);
      matakanan->print(fb);
      matakiri->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==2){
      bibirlebar->print(fb);
      senyum->print(fb);
      matakanan->print(fb);
      matakiri->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==3){
      bibirsempit->print(fb);
      sedih->print(fb);
      matakanansipit->print(fb);
      matakirisipit->print(fb);
      tangisankiri->print(fb);
      tangisankanan->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==4){
      mulut->print(fb);
      matakananmerem->print(fb);
      matakirimerem->print(fb);
    }
    else if(mode==5){
      bibirlebar->print(fb);
      tertawa->print(fb);
      gigi->print(fb);
      matakananmerem->print(fb);
      matakirimerem->print(fb);
    }
    rambut->print(fb);
    rambut->print_frame(fb,255,255,255,0);
  }